

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::GenerateCustomRuleFile
          (cmMakefileTargetGenerator *this,cmCustomCommandGenerator *ccg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLocalUnixMakefileGenerator3 *this_00;
  cmGlobalUnixMakefileGenerator3 *this_01;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_00;
  ImplicitDependsList *pIVar4;
  pointer lang;
  string objFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string srcFullPath;
  string comment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  ostringstream content;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  EchoProgress local_1a8;
  ios_base local_138 [264];
  
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalGenerator::ConstructComment_abi_cxx11_
            (&local_1e8,&this->LocalGenerator->super_cmLocalGenerator,ccg,"");
  if ((local_1e8._M_string_length != 0) &&
     (this->NumberOfProgressActions = this->NumberOfProgressActions + 1,
     this->NoRuleMessages == false)) {
    paVar1 = &local_1a8.Dir.field_2;
    local_1a8.Dir._M_string_length = 0;
    local_1a8.Dir.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_1a8.Arg.field_2;
    local_1a8.Arg._M_string_length = 0;
    local_1a8.Arg.field_2._M_local_buf[0] = '\0';
    local_1a8.Dir._M_dataplus._M_p = (pointer)paVar1;
    local_1a8.Arg._M_dataplus._M_p = (pointer)paVar2;
    MakeEchoProgress(this,&local_1a8);
    this_00 = this->LocalGenerator;
    std::__cxx11::string::string
              ((string *)&local_248,local_1e8._M_dataplus._M_p,(allocator *)&local_208);
    cmLocalUnixMakefileGenerator3::AppendEcho(this_00,&local_228,&local_248,EchoGenerate,&local_1a8)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.Arg._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8.Arg._M_dataplus._M_p,
                      CONCAT71(local_1a8.Arg.field_2._M_allocated_capacity._1_7_,
                               local_1a8.Arg.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.Dir._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8.Dir._M_dataplus._M_p,
                      CONCAT71(local_1a8.Dir.field_2._M_allocated_capacity._1_7_,
                               local_1a8.Dir.field_2._M_local_buf[0]) + 1);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  cmLocalUnixMakefileGenerator3::AppendCustomCommand
            (this->LocalGenerator,&local_228,ccg,this->Target,false,HOME_OUTPUT,
             (ostream *)&local_1a8);
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalUnixMakefileGenerator3::AppendCustomDepend(this->LocalGenerator,&local_1c8,ccg);
  outputs = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
  bVar3 = WriteMakeRule(this,(ostream *)this->BuildFileStream,(char *)0x0,outputs,&local_1c8,
                        &local_228,false);
  if (!bVar3) {
    this_01 = this->GlobalGenerator;
    outputs_00 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    std::__cxx11::stringbuf::str();
    cmGlobalGenerator::AddRuleHash(&this_01->super_cmGlobalGenerator,outputs_00,&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  pIVar4 = cmCustomCommand::GetImplicitDepends(ccg->CC);
  lang = (pIVar4->
         super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    pIVar4 = cmCustomCommand::GetImplicitDepends(ccg->CC);
    if (lang == (pIVar4->
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
    cmOutputConverter::Convert
              (&local_248,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,FULL,UNCHANGED);
    cmOutputConverter::Convert
              (&local_208,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               &lang->second,FULL,UNCHANGED);
    cmLocalUnixMakefileGenerator3::AddImplicitDepends
              (this->LocalGenerator,this->Target,&lang->first,local_248._M_dataplus._M_p,
               local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    lang = lang + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return;
}

Assistant:

void cmMakefileTargetGenerator
::GenerateCustomRuleFile(cmCustomCommandGenerator const& ccg)
{
  // Collect the commands.
  std::vector<std::string> commands;
  std::string comment = this->LocalGenerator->ConstructComment(ccg);
  if(!comment.empty())
    {
    // add in a progress call if needed
    this->NumberOfProgressActions++;
    if(!this->NoRuleMessages)
      {
      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      this->MakeEchoProgress(progress);
      this->LocalGenerator
        ->AppendEcho(commands, comment.c_str(),
                     cmLocalUnixMakefileGenerator3::EchoGenerate,
                     &progress);
      }
    }

  // Now append the actual user-specified commands.
  std::ostringstream content;
  this->LocalGenerator->AppendCustomCommand(commands, ccg, this->Target, false,
                                            cmLocalGenerator::HOME_OUTPUT,
                                            &content);

  // Collect the dependencies.
  std::vector<std::string> depends;
  this->LocalGenerator->AppendCustomDepend(depends, ccg);

  // Write the rule.
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  bool symbolic = this->WriteMakeRule(*this->BuildFileStream, 0,
                                      outputs, depends, commands);

  // If the rule has changed make sure the output is rebuilt.
  if(!symbolic)
    {
    this->GlobalGenerator->AddRuleHash(ccg.GetOutputs(), content.str());
    }

  // Setup implicit dependency scanning.
  for(cmCustomCommand::ImplicitDependsList::const_iterator
        idi = ccg.GetCC().GetImplicitDepends().begin();
      idi != ccg.GetCC().GetImplicitDepends().end(); ++idi)
    {
    std::string objFullPath =
      this->Convert(outputs[0], cmLocalGenerator::FULL);
    std::string srcFullPath =
      this->Convert(idi->second, cmLocalGenerator::FULL);
    this->LocalGenerator->
      AddImplicitDepends(*this->Target, idi->first,
                         objFullPath.c_str(),
                         srcFullPath.c_str());
    }
}